

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

uECC_word_t
EccPoint_compute_public_key(uECC_word_t *result,uECC_word_t *private_key,uECC_Curve curve)

{
  uECC_word_t uVar1;
  uECC_word_t carry;
  uECC_word_t *p2 [2];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_Curve curve_local;
  uECC_word_t *private_key_local;
  uECC_word_t *result_local;
  
  p2[0] = (uECC_word_t *)(p2 + 1);
  uVar1 = regularize_k(private_key,tmp2 + 3,(uECC_word_t *)(p2 + 1),curve);
  EccPoint_mult(result,curve->G,p2[(long)(int)(uint)((uVar1 != 0 ^ 0xffU) & 1) + -1],
                (uECC_word_t *)0x0,curve->num_n_bits + 1,curve);
  uVar1 = uECC_vli_isZero(result,curve->num_words << 1);
  result_local = (uECC_word_t *)(ulong)(uVar1 == 0);
  return (uECC_word_t)result_local;
}

Assistant:

static uECC_word_t EccPoint_compute_public_key(uECC_word_t *result,
                                               uECC_word_t *private_key,
                                               uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {tmp1, tmp2};
    uECC_word_t carry;

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(private_key, tmp1, tmp2, curve);

    EccPoint_mult(result, curve->G, p2[!carry], 0, curve->num_n_bits + 1, curve);

    if (EccPoint_isZero(result, curve)) {
        return 0;
    }
    return 1;
}